

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O3

void store_pack_float80(uint32 ea,int k,floatx80 fpr)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint32 uVar4;
  float64 fVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  byte *pbVar16;
  uint value;
  uint value_00;
  bool bVar17;
  floatx80 a;
  char str [128];
  byte local_b8 [18];
  byte local_a6 [118];
  
  a._4_4_ = 0;
  a._0_4_ = fpr._0_4_;
  a.low = fpr.low;
  fVar5 = floatx80_to_float64(a);
  sprintf((char *)local_b8,"%.16e",fVar5);
  bVar17 = local_b8[0] == 0x2d;
  uVar8 = (ulong)bVar17;
  pbVar6 = local_b8 + 1;
  if (bVar17) {
    pbVar6 = local_b8 + 2;
  }
  bVar12 = local_b8[uVar8];
  pbVar16 = local_b8 + 3;
  if (!bVar17) {
    pbVar16 = local_b8 + 2;
  }
  uVar2 = uVar8;
  if (bVar12 == 0x2b) {
    pbVar6 = local_b8 + uVar8 + 2;
    uVar2 = uVar8 + 1;
  }
  if (bVar12 == 0x2b) {
    pbVar16 = local_b8 + uVar8 + 3;
  }
  bVar13 = local_b8[uVar2];
  bVar1 = *pbVar6;
  if (bVar1 != 0x2e) {
    pbVar16 = pbVar6;
  }
  uVar14 = k;
  if (k + 0xdU < 0xe) {
    pbVar6 = local_a6 + 2;
    if (local_b8[0] != 0x2d) {
      pbVar6 = local_a6 + 1;
    }
    pbVar9 = local_a6 + (ulong)(local_b8[0] == 0x2d) + 2;
    if (bVar12 == 0x2b) {
      pbVar6 = pbVar9;
      pbVar9 = local_a6 + uVar8 + 3;
    }
    if (bVar1 == 0x2e) {
      pbVar6 = pbVar9;
    }
    lVar15 = 0;
    uVar14 = 0;
    do {
      uVar10 = uVar14 << 4 | (int)(char)(pbVar6[lVar15] - 0x30);
      if (9 < (byte)(pbVar6[lVar15] - 0x30)) {
        uVar10 = uVar14;
      }
      uVar14 = uVar10;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    uVar8 = (ulong)(local_b8[0] == 0x2d);
    pbVar6 = local_a6;
    if (local_b8[0] == 0x2d) {
      pbVar6 = local_a6 + 1;
    }
    lVar15 = uVar8 + 0x13;
    if (bVar12 == 0x2b) {
      lVar15 = uVar8 + 0x14;
    }
    pbVar9 = local_a6 + uVar8 + 1;
    if (bVar12 != 0x2b) {
      pbVar9 = pbVar6;
    }
    pbVar6 = local_b8 + lVar15;
    if (bVar1 != 0x2e) {
      pbVar6 = pbVar9;
    }
    uVar10 = -uVar14;
    if (*pbVar6 != 0x2d) {
      uVar10 = uVar14;
    }
    iVar7 = uVar10 - k;
    if ('4' < (char)pbVar16[iVar7]) {
      pbVar16[(int)(~k + uVar10)] = pbVar16[(int)(~k + uVar10)] + 1;
    }
    uVar14 = 0;
    if (iVar7 < 0x10) {
      memset(pbVar16 + iVar7,0x30,(ulong)((k - uVar10) + 0xf) + 1);
    }
  }
  uVar10 = (int)(char)bVar13 - 0x30U | (uint)bVar17 << 0x1f;
  iVar7 = 8;
  value = 0;
  do {
    bVar12 = *pbVar16 - 0x30;
    bVar17 = bVar12 < 10;
    if (!bVar17) {
      bVar12 = 0;
    }
    pbVar16 = pbVar16 + bVar17;
    value = (int)(char)bVar12 | value << 4;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 8;
  value_00 = 0;
  do {
    bVar13 = *pbVar16 - 0x30;
    bVar12 = bVar13;
    if (bVar13 >= 10) {
      bVar12 = 0;
    }
    pbVar16 = pbVar16 + (bVar13 < 10);
    value_00 = (int)(char)bVar12 | value_00 << 4;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  if (uVar14 - 1 < 0x11) {
    value = value & pkmask2[uVar14];
    value_00 = value_00 & pkmask3[uVar14];
  }
  if ((*pbVar16 | 0x20) == 0x65) {
    bVar12 = pbVar16[1];
    pbVar6 = pbVar16 + 2;
    pbVar9 = pbVar16 + 3;
    if (bVar12 != 0x2d) {
      pbVar9 = pbVar6;
      pbVar6 = pbVar16 + 1;
    }
    if (pbVar16[(ulong)(bVar12 == 0x2d) + 1] != 0x2b) {
      pbVar9 = pbVar6;
    }
    uVar14 = 0;
    iVar7 = 3;
    do {
      bVar13 = *pbVar9 - 0x30;
      pbVar9 = pbVar9 + (bVar13 < 10);
      uVar3 = uVar14 << 4 | (int)(char)bVar13;
      if (9 < bVar13) {
        uVar3 = uVar14;
      }
      uVar14 = uVar3;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    if (bVar12 == 0x2d) {
      uVar10 = uVar10 | 0x40000000;
    }
    uVar10 = uVar10 | uVar14 << 0x10;
  }
  my_fc_handler(m68ki_cpu.s_flag | 1);
  uVar4 = ea;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(ea);
  }
  m68k_write_memory_32(uVar4 & m68ki_cpu.address_mask,uVar10);
  uVar11 = ea + 4;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar11 = pmmu_translate_addr(uVar11);
  }
  m68k_write_memory_32(uVar11 & m68ki_cpu.address_mask,value);
  uVar11 = ea + 8;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar11 = pmmu_translate_addr(uVar11);
  }
  m68k_write_memory_32(uVar11 & m68ki_cpu.address_mask,value_00);
  return;
}

Assistant:

static inline void store_pack_float80(uint32 ea, int k, floatx80 fpr)
{
	uint32 dw1, dw2, dw3;
	char str[128], *ch;
	int i, j, exp;

	dw1 = dw2 = dw3 = 0;
	ch = &str[0];

	sprintf(str, "%.16e", fx80_to_double(fpr));

	if (*ch == '-')
	{
		ch++;
		dw1 = 0x80000000;
	}

	if (*ch == '+')
	{
		ch++;
	}

	dw1 |= (*ch++ - '0');

	if (*ch == '.')
	{
		ch++;
	}

	// handle negative k-factor here
	if ((k <= 0) && (k >= -13))
	{
		exp = 0;
		for (i = 0; i < 3; i++)
		{
			if (ch[18+i] >= '0' && ch[18+i] <= '9')
			{
				exp = (exp << 4) | (ch[18+i] - '0');
			}
		}

		if (ch[17] == '-')
		{
			exp = -exp;
		}

		k = -k;
		// last digit is (k + exponent - 1)
		k += (exp - 1);

		// round up the last significant mantissa digit
		if (ch[k+1] >= '5')
		{
			ch[k]++;
		}

		// zero out the rest of the mantissa digits
		for (j = (k+1); j < 16; j++)
		{
			ch[j] = '0';
		}

		// now zero out K to avoid tripping the positive K detection below
		k = 0;
	}

	// crack 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw2 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		{
			dw2 |= *ch++ - '0';
		}
	}

	// next 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw3 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		dw3 |= *ch++ - '0';
	}

	// handle masking if k is positive
	if (k >= 1)
	{
		if (k <= 17)
		{
			dw2 &= pkmask2[k];
			dw3 &= pkmask3[k];
		}
		else
		{
			dw2 &= pkmask2[17];
			dw3 &= pkmask3[17];
//			m68ki_cpu.fpcr |=  (need to set OPERR bit)
		}
	}

	// finally, crack the exponent
	if (*ch == 'e' || *ch == 'E')
	{
		ch++;
		if (*ch == '-')
		{
			ch++;
			dw1 |= 0x40000000;
		}

		if (*ch == '+')
		{
			ch++;
		}

		j = 0;
		for (i = 0; i < 3; i++)
		{
			if (*ch >= '0' && *ch <= '9')
			{
				j = (j << 4) | (*ch++ - '0');
			}
		}

		dw1 |= (j << 16);
	}

	m68ki_write_32(ea, dw1);
	m68ki_write_32(ea+4, dw2);
	m68ki_write_32(ea+8, dw3);
}